

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O2

void dump_regs(int cnum,FILE *outf,uint32_t *ref_val,int ref_exist,uint32_t reg,uint32_t regs_len,
              color color)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  int i;
  uint uVar5;
  ulong uVar6;
  uint32_t local_6c;
  ulong local_68;
  int local_60;
  uint32_t local_5c;
  uint local_58;
  uint32_t local_54;
  uint32_t *local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_60 = ref_exist;
  local_50 = ref_val;
  local_38 = (ulong)regs_len;
  local_48 = (ulong)reg;
  local_40 = (long)cnum << 5;
  uVar6 = 0;
  do {
    if (local_38 <= uVar6) {
      return;
    }
    local_68 = uVar6 + local_48;
    local_58 = (uint)uVar6 & 0xc;
    if ((uVar6 & 0xc) == 0) {
      fprintf((FILE *)outf,"%08x: ",local_68);
    }
    local_5c = *(uint32_t *)(*(long *)((long)&nva_cards->bar0 + local_40) + local_68);
    local_68 = uVar6;
    local_54 = local_50[uVar6];
    local_6c = local_5c;
    for (uVar5 = 3; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
      uVar6 = (ulong)uVar5;
      if (color == NO_COLOR) {
        bVar1 = *(byte *)((long)&local_6c + uVar6);
LAB_00103878:
        pcVar3 = "";
        pcVar4 = "";
        bVar2 = bVar1;
      }
      else {
        bVar1 = *(byte *)((long)&local_54 + uVar6);
        pcVar3 = "\x1b[0;31m";
        pcVar4 = "\x1b[0m";
        bVar2 = *(byte *)((long)&local_6c + uVar6);
        if (bVar1 == *(byte *)((long)&local_6c + uVar6)) goto LAB_00103878;
      }
      fprintf((FILE *)outf,"%s%02x%s",pcVar3,(ulong)bVar2,pcVar4);
    }
    fputc(0x20,(FILE *)outf);
    uVar6 = local_68;
    if (local_60 == 0) {
      local_50[local_68] = local_5c;
    }
    if (local_58 == 0xc) {
      fputc(10,(FILE *)outf);
    }
    uVar6 = uVar6 + 4;
  } while( true );
}

Assistant:

static void
dump_regs(int cnum, FILE* outf, uint32_t ref_val[], int ref_exist, uint32_t reg, uint32_t regs_len, enum color color)
{
	uint32_t val;
	int r;

	for (r = 0; r < regs_len; r+=4)
        {
                if (r % 0x10 == 0)
                        fprintf(outf, "%08x: ", reg + r);

                val = nva_rd32(cnum, reg + r);

                print_reg_diff(outf, ref_val[r], val, color);

                /* if the value wasn't initialized before, store it as a reference */
                if (ref_exist == 0)
                        ref_val[r] = val;

                if (r % 0x10 == 0xc)
                        fprintf(outf, "\n");
        }
}